

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRResampler.cpp
# Opt level: O2

void __thiscall
SRCTools::FIRResampler::getOutSamplesStereo(FIRResampler *this,FloatSample **outSamples)

{
  double __x;
  FloatSample aFVar1 [2];
  FIRCoefficient *pFVar2;
  FloatSample *pFVar3;
  double dVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  uVar7 = this->ringBufferPosition;
  __x = this->phase;
  if ((this->constants).usePhaseInterpolation == true) {
    dVar4 = floor(__x);
    pFVar2 = (this->constants).taps;
    fVar8 = 0.0;
    fVar9 = 0.0;
    uVar6 = (ulong)__x;
    while (uVar5 = (uint)uVar6, uVar5 < (this->constants).numberOfTaps - (uint)(__x - dVar4 != 0.0))
    {
      fVar10 = pFVar2[uVar6 & 0xffffffff];
      fVar10 = (float)((double)(pFVar2[uVar5 + 1] - fVar10) * (__x - dVar4) + (double)fVar10);
      aFVar1 = (this->constants).ringBuffer[uVar7];
      fVar8 = fVar8 + fVar10 * aFVar1[0];
      fVar9 = fVar9 + fVar10 * aFVar1[1];
      uVar7 = uVar7 + 1 & (this->constants).delayLineMask;
      uVar6 = (ulong)(uVar5 + (this->constants).numberOfPhases);
    }
  }
  else {
    fVar8 = 0.0;
    fVar9 = 0.0;
    for (uVar6 = (ulong)__x; (uint)uVar6 < (this->constants).numberOfTaps;
        uVar6 = (ulong)((uint)uVar6 + (this->constants).numberOfPhases)) {
      aFVar1 = (this->constants).ringBuffer[uVar7];
      fVar10 = (this->constants).taps[uVar6 & 0xffffffff];
      fVar8 = fVar8 + fVar10 * aFVar1[0];
      fVar9 = fVar9 + fVar10 * aFVar1[1];
      uVar7 = uVar7 + 1 & (this->constants).delayLineMask;
    }
  }
  pFVar3 = *outSamples;
  *outSamples = pFVar3 + 2;
  *(ulong *)pFVar3 = CONCAT44(fVar9,fVar8);
  this->phase = __x + (this->constants).phaseIncrement;
  return;
}

Assistant:

void FIRResampler::getOutSamplesStereo(FloatSample *&outSamples) {
	FloatSample leftSample = 0.0;
	FloatSample rightSample = 0.0;
	unsigned int delaySampleIx = ringBufferPosition;
	if (constants.usePhaseInterpolation) {
		double phaseFraction = phase - floor(phase);
		unsigned int maxTapIx = phaseFraction == 0 ? constants.numberOfTaps : constants.numberOfTaps - 1;
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < maxTapIx; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = FIRCoefficient(constants.taps[tapIx] + (constants.taps[tapIx + 1] - constants.taps[tapIx]) * phaseFraction);
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	} else {
		// Optimised for rational resampling ratios when phase is always integer
		for (unsigned int tapIx = static_cast<unsigned int>(phase); tapIx < constants.numberOfTaps; tapIx += constants.numberOfPhases) {
			FIRCoefficient tap = constants.taps[tapIx];
			leftSample += tap * constants.ringBuffer[delaySampleIx][0];
			rightSample += tap * constants.ringBuffer[delaySampleIx][1];
			delaySampleIx = (delaySampleIx + 1) & constants.delayLineMask;
		}
	}
	*(outSamples++) = leftSample;
	*(outSamples++) = rightSample;
	phase += constants.phaseIncrement;
}